

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWPointerArray.h
# Opt level: O3

void __thiscall
COLLADAFW::PointerArray<COLLADAFW::Node>::~PointerArray(PointerArray<COLLADAFW::Node> *this)

{
  ArrayPrimitiveType<COLLADAFW::Node_*> *pAVar1;
  size_t sVar2;
  size_t sVar3;
  
  this->_vptr_PointerArray = (_func_int **)&PTR__PointerArray_00909100;
  pAVar1 = &this->super_ArrayPrimitiveType<COLLADAFW::Node_*>;
  sVar2 = (this->super_ArrayPrimitiveType<COLLADAFW::Node_*>).mCount;
  if (sVar2 != 0) {
    sVar3 = 0;
    do {
      if (pAVar1->mData[sVar3] != (Node *)0x0) {
        (*(pAVar1->mData[sVar3]->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)424>).
          super_Object._vptr_Object[1])();
      }
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  if (((this->super_ArrayPrimitiveType<COLLADAFW::Node_*>).mFlags & 1) != 0) {
    free(pAVar1->mData);
    pAVar1->mData = (Node **)0x0;
    (this->super_ArrayPrimitiveType<COLLADAFW::Node_*>).mCount = 0;
    (this->super_ArrayPrimitiveType<COLLADAFW::Node_*>).mCapacity = 0;
  }
  return;
}

Assistant:

virtual ~PointerArray()
		{
			deleteContents();
		}